

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v8::detail::
     for_each_codepoint<fmt::v8::detail::compute_width(fmt::v8::basic_string_view<char>)::count_code_points>
               (string_view s,count_code_points f)

{
  size_t sVar1;
  char *pcVar2;
  anon_class_8_1_54a39806 *this;
  char buf [7];
  long num_chars_left;
  char *end;
  size_t block_size;
  char *p;
  anon_class_8_1_54a39806 decode;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  anon_class_8_1_54a39806 *in_stack_ffffffffffffffc0;
  char *local_28;
  basic_string_view<char> local_10;
  
  local_28 = basic_string_view<char>::data(&local_10);
  sVar1 = basic_string_view<char>::size(&local_10);
  if (3 < sVar1) {
    in_stack_ffffffffffffffb0 = local_28;
    sVar1 = basic_string_view<char>::size(&local_10);
    pcVar2 = in_stack_ffffffffffffffb0 + (sVar1 - 3);
    while (local_28 < pcVar2) {
      local_28 = for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                           (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  pcVar2 = basic_string_view<char>::data(&local_10);
  sVar1 = basic_string_view<char>::size(&local_10);
  this = (anon_class_8_1_54a39806 *)(pcVar2 + (sVar1 - (long)local_28));
  if (this != (anon_class_8_1_54a39806 *)0x0) {
    memset(&stack0xffffffffffffffb9,0,7);
    copy_str<char,_0>((char *)this,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    do {
      pcVar2 = for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                         (this,in_stack_ffffffffffffffb8);
    } while ((long)pcVar2 - (long)&stack0xffffffffffffffb9 < (long)this);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    f(cp, error);
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = decode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    p = buf;
    do {
      p = decode(p);
    } while (p - buf < num_chars_left);
  }
}